

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O1

int ixxx::posix::fsync(int __fd)

{
  int iVar1;
  fsync_error *this;
  int *piVar2;
  
  iVar1 = ::fsync(__fd);
  if (iVar1 != -1) {
    return iVar1;
  }
  this = (fsync_error *)__cxa_allocate_exception(0x20);
  piVar2 = __errno_location();
  fsync_error::sys_error(this,*piVar2,(char *)0x0,ERRNO);
  __cxa_throw(this,&fsync_error::typeinfo,ixxx::sys_error::~sys_error);
}

Assistant:

void fsync(int fd)
    {
#if (defined(__MINGW32__) || defined(__MINGW64__))
        HANDLE h = reinterpret_cast<HANDLE>(_get_osfhandle(fd));
        if (h == INVALID_HANDLE_VALUE)
            throw fsync_error("invalid handle - _get_osfhandle()");
        auto r = FlushFileBuffers(h);
        if (!r)
            throw fsync_error("FlushFileBuffers failed");
#else
      int r = ::fsync(fd);
      if (r == -1)
        throw fsync_error(errno);
#endif
    }